

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O0

void __thiscall
ImplDispatchTest_AES_set_encrypt_key_Test::TestBody(ImplDispatchTest_AES_set_encrypt_key_Test *this)

{
  initializer_list<std::pair<unsigned_long,_bool>_> __l;
  byte local_92;
  anon_class_1_0_00000001 local_91;
  function<void_()> local_90;
  allocator<std::pair<unsigned_long,_bool>_> local_5a;
  bool local_59;
  pair<unsigned_long,_bool> local_58;
  pair<unsigned_long,_bool> pStack_48;
  iterator local_38;
  size_type local_30;
  vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_> local_28;
  ImplDispatchTest_AES_set_encrypt_key_Test *local_10;
  ImplDispatchTest_AES_set_encrypt_key_Test *this_local;
  
  local_10 = this;
  std::pair<unsigned_long,_bool>::pair<bool_&,_true>
            (&local_58,&kFlag_aes_hw_set_encrypt_key,&(this->super_ImplDispatchTest).aesni_);
  local_92 = 0;
  if (((this->super_ImplDispatchTest).ssse3_ & 1U) != 0) {
    local_92 = (this->super_ImplDispatchTest).aesni_ ^ 0xff;
  }
  local_59 = (bool)(local_92 & 1);
  std::pair<unsigned_long,_bool>::pair<bool,_true>
            (&pStack_48,&kFlag_vpaes_set_encrypt_key,&local_59);
  local_38 = &local_58;
  local_30 = 2;
  std::allocator<std::pair<unsigned_long,_bool>_>::allocator(&local_5a);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  vector(&local_28,__l,&local_5a);
  std::function<void()>::function<ImplDispatchTest_AES_set_encrypt_key_Test::TestBody()::__0,void>
            ((function<void()> *)&local_90,&local_91);
  ImplDispatchTest::AssertFunctionsHit(&this->super_ImplDispatchTest,&local_28,&local_90);
  std::function<void_()>::~function(&local_90);
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  ~vector(&local_28);
  std::allocator<std::pair<unsigned_long,_bool>_>::~allocator(&local_5a);
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AES_set_encrypt_key) {
  AssertFunctionsHit(
      {
          {kFlag_aes_hw_set_encrypt_key, aesni_},
          {kFlag_vpaes_set_encrypt_key, ssse3_ && !aesni_},
      },
      [] {
        AES_KEY key;
        static const uint8_t kZeros[16] = {0};
        AES_set_encrypt_key(kZeros, sizeof(kZeros) * 8, &key);
      });
}